

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall perfetto::protos::gen::TrackEvent::operator==(TrackEvent *this,TrackEvent *other)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  
  sVar6 = (this->unknown_fields_)._M_string_length;
  if (sVar6 == (other->unknown_fields_)._M_string_length) {
    if ((sVar6 != 0) &&
       (iVar4 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,sVar6), iVar4 != 0)) {
      return false;
    }
    __s1 = (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->category_iids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar6 = (long)puVar1 - (long)__s1;
    __s2 = (other->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (sVar6 == (long)(other->category_iids_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)__s2) {
      if ((puVar1 != __s1) && (iVar4 = bcmp(__s1,__s2,sVar6), iVar4 != 0)) {
        return false;
      }
      __first1 = (this->categories_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      __last1 = (this->categories_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __first2 = (other->categories_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (((((long)__last1 - (long)__first1 ==
             (long)(other->categories_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
           (bVar3 = ::std::__equal<false>::
                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                              (__first1,__last1,__first2), bVar3)) &&
          (this->name_iid_ == other->name_iid_)) &&
         (sVar6 = (this->name_)._M_string_length, sVar6 == (other->name_)._M_string_length)) {
        if ((sVar6 != 0) &&
           (iVar4 = bcmp((this->name_)._M_dataplus._M_p,(other->name_)._M_dataplus._M_p,sVar6),
           iVar4 != 0)) {
          return false;
        }
        if (((this->type_ == other->type_) && (this->track_uuid_ == other->track_uuid_)) &&
           (this->counter_value_ == other->counter_value_)) {
          if ((((this->double_counter_value_ == other->double_counter_value_) &&
               (!NAN(this->double_counter_value_) && !NAN(other->double_counter_value_))) &&
              (bVar3 = ::std::operator==(&this->extra_counter_track_uuids_,
                                         &other->extra_counter_track_uuids_), bVar3)) &&
             ((bVar3 = ::std::operator==(&this->extra_counter_values_,&other->extra_counter_values_)
              , bVar3 &&
              (bVar3 = ::std::operator==(&this->extra_double_counter_track_uuids_,
                                         &other->extra_double_counter_track_uuids_), bVar3)))) {
            pdVar5 = (this->extra_double_counter_values_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = (this->extra_double_counter_values_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pdVar7 = (other->extra_double_counter_values_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((long)pdVar2 - (long)pdVar5 ==
                (long)(other->extra_double_counter_values_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar7) {
              for (; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
                if (*pdVar5 != *pdVar7) {
                  return false;
                }
                if (NAN(*pdVar5) || NAN(*pdVar7)) {
                  return false;
                }
                pdVar7 = pdVar7 + 1;
              }
              bVar3 = ::std::operator==(&this->flow_ids_,&other->flow_ids_);
              if ((((bVar3) &&
                   (bVar3 = ::std::operator==(&this->terminating_flow_ids_,
                                              &other->terminating_flow_ids_), bVar3)) &&
                  ((((bVar3 = ::std::operator==(&this->debug_annotations_,&other->debug_annotations_
                                               ), bVar3 &&
                     (((bVar3 = TaskExecution::operator==
                                          ((this->task_execution_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::TaskExecution,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::TaskExecution_*,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::TaskExecution_*,_false>
                                           ._M_head_impl,
                                           (other->task_execution_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::TaskExecution,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::TaskExecution_*,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::TaskExecution_*,_false>
                                           ._M_head_impl), bVar3 &&
                       (bVar3 = LogMessage::operator==
                                          ((this->log_message_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::LogMessage,_std::default_delete<perfetto::protos::gen::LogMessage>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::LogMessage_*,_std::default_delete<perfetto::protos::gen::LogMessage>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::LogMessage_*,_false>
                                           ._M_head_impl,
                                           (other->log_message_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::LogMessage,_std::default_delete<perfetto::protos::gen::LogMessage>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::LogMessage_*,_std::default_delete<perfetto::protos::gen::LogMessage>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::LogMessage_*,_false>
                                           ._M_head_impl), bVar3)) &&
                      (bVar3 = ChromeCompositorSchedulerState::operator==
                                         ((this->cc_scheduler_state_).ptr_._M_t.
                                          super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
                                          .
                                          super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_false>
                                          ._M_head_impl,
                                          (other->cc_scheduler_state_).ptr_._M_t.
                                          super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
                                          .
                                          super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_false>
                                          ._M_head_impl), bVar3)))) &&
                    ((bVar3 = ChromeUserEvent::operator==
                                        ((this->chrome_user_event_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeUserEvent,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_user_event_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeUserEvent,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_false>
                                         ._M_head_impl), bVar3 &&
                     (bVar3 = ChromeKeyedService::operator==
                                        ((this->chrome_keyed_service_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_keyed_service_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>
                                         ._M_head_impl), bVar3)))) &&
                   (bVar3 = ChromeLegacyIpc::operator==
                                      ((this->chrome_legacy_ipc_).ptr_._M_t.
                                       super___uniq_ptr_impl<perfetto::protos::gen::ChromeLegacyIpc,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
                                       .
                                       super__Head_base<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_false>
                                       ._M_head_impl,
                                       (other->chrome_legacy_ipc_).ptr_._M_t.
                                       super___uniq_ptr_impl<perfetto::protos::gen::ChromeLegacyIpc,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
                                       .
                                       super__Head_base<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_false>
                                       ._M_head_impl), bVar3)))) &&
                 (((((bVar3 = ChromeHistogramSample::operator==
                                        ((this->chrome_histogram_sample_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_histogram_sample_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>
                                         ._M_head_impl), bVar3 &&
                     (bVar3 = ChromeLatencyInfo::operator==
                                        ((this->chrome_latency_info_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeLatencyInfo,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_latency_info_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeLatencyInfo,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_false>
                                         ._M_head_impl), bVar3)) &&
                    ((bVar3 = ChromeFrameReporter::operator==
                                        ((this->chrome_frame_reporter_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeFrameReporter,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_frame_reporter_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeFrameReporter,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_false>
                                         ._M_head_impl), bVar3 &&
                     (((bVar3 = ChromeApplicationStateInfo::operator==
                                          ((this->chrome_application_state_info_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::ChromeApplicationStateInfo,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_false>
                                           ._M_head_impl,
                                           (other->chrome_application_state_info_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::ChromeApplicationStateInfo,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_false>
                                           ._M_head_impl), bVar3 &&
                       (bVar3 = ChromeRendererSchedulerState::operator==
                                          ((this->chrome_renderer_scheduler_state_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::ChromeRendererSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_false>
                                           ._M_head_impl,
                                           (other->chrome_renderer_scheduler_state_).ptr_._M_t.
                                           super___uniq_ptr_impl<perfetto::protos::gen::ChromeRendererSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
                                           .
                                           super__Head_base<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_false>
                                           ._M_head_impl), bVar3)) &&
                      (bVar3 = ChromeWindowHandleEventInfo::operator==
                                         ((this->chrome_window_handle_event_info_).ptr_._M_t.
                                          super___uniq_ptr_impl<perfetto::protos::gen::ChromeWindowHandleEventInfo,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
                                          .
                                          super__Head_base<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_false>
                                          ._M_head_impl,
                                          (other->chrome_window_handle_event_info_).ptr_._M_t.
                                          super___uniq_ptr_impl<perfetto::protos::gen::ChromeWindowHandleEventInfo,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
                                          .
                                          super__Head_base<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_false>
                                          ._M_head_impl), bVar3)))))) &&
                   ((bVar3 = ChromeContentSettingsEventInfo::operator==
                                       ((this->chrome_content_settings_event_info_).ptr_._M_t.
                                        super___uniq_ptr_impl<perfetto::protos::gen::ChromeContentSettingsEventInfo,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
                                        .
                                        super__Head_base<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_false>
                                        ._M_head_impl,
                                        (other->chrome_content_settings_event_info_).ptr_._M_t.
                                        super___uniq_ptr_impl<perfetto::protos::gen::ChromeContentSettingsEventInfo,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
                                        .
                                        super__Head_base<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_false>
                                        ._M_head_impl), bVar3 &&
                    (bVar3 = SourceLocation::operator==
                                       ((this->source_location_).ptr_._M_t.
                                        super___uniq_ptr_impl<perfetto::protos::gen::SourceLocation,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_perfetto::protos::gen::SourceLocation_*,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
                                        .
                                        super__Head_base<0UL,_perfetto::protos::gen::SourceLocation_*,_false>
                                        ._M_head_impl,
                                        (other->source_location_).ptr_._M_t.
                                        super___uniq_ptr_impl<perfetto::protos::gen::SourceLocation,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_perfetto::protos::gen::SourceLocation_*,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
                                        .
                                        super__Head_base<0UL,_perfetto::protos::gen::SourceLocation_*,_false>
                                        ._M_head_impl), bVar3)))) &&
                  ((this->source_location_iid_ == other->source_location_iid_ &&
                   (((bVar3 = ChromeMessagePump::operator==
                                        ((this->chrome_message_pump_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeMessagePump,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_message_pump_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeMessagePump,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_false>
                                         ._M_head_impl), bVar3 &&
                     (bVar3 = ChromeMojoEventInfo::operator==
                                        ((this->chrome_mojo_event_info_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeMojoEventInfo,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_false>
                                         ._M_head_impl,
                                         (other->chrome_mojo_event_info_).ptr_._M_t.
                                         super___uniq_ptr_impl<perfetto::protos::gen::ChromeMojoEventInfo,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
                                         .
                                         super__Head_base<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_false>
                                         ._M_head_impl), bVar3)) &&
                    ((this->timestamp_delta_us_ == other->timestamp_delta_us_ &&
                     ((((this->timestamp_absolute_us_ == other->timestamp_absolute_us_ &&
                        (this->thread_time_delta_us_ == other->thread_time_delta_us_)) &&
                       (this->thread_time_absolute_us_ == other->thread_time_absolute_us_)) &&
                      ((this->thread_instruction_count_delta_ ==
                        other->thread_instruction_count_delta_ &&
                       (this->thread_instruction_count_absolute_ ==
                        other->thread_instruction_count_absolute_)))))))))))))) {
                bVar3 = TrackEvent_LegacyEvent::operator==
                                  ((this->legacy_event_).ptr_._M_t.
                                   super___uniq_ptr_impl<perfetto::protos::gen::TrackEvent_LegacyEvent,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
                                   .
                                   super__Head_base<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_false>
                                   ._M_head_impl,
                                   (other->legacy_event_).ptr_._M_t.
                                   super___uniq_ptr_impl<perfetto::protos::gen::TrackEvent_LegacyEvent,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
                                   .
                                   super__Head_base<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_false>
                                   ._M_head_impl);
                return bVar3;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }